

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

uint8_t * __thiscall
CoreML::Specification::ArrayFeatureType::_InternalSerialize
          (ArrayFeatureType *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  ArrayFeatureType_ArrayDataType AVar4;
  int32_t value;
  RepeatedField<long> *this_00;
  LogMessage *other;
  long *plVar5;
  byte *pbVar6;
  uint64_t uVar7;
  uint8_t *puVar8;
  ArrayFeatureType_EnumeratedShapes *value_00;
  ArrayFeatureType_ShapeRange *value_01;
  void *data;
  long *plVar9;
  float value_02;
  double value_03;
  int byte_size;
  uint32_t cached_has_bits;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  ArrayFeatureType *this_local;
  memory_order __b;
  long *end;
  long *it;
  EpsCopyOutputStream *local_f0;
  EpsCopyOutputStream *local_c8;
  ulong local_c0;
  EpsCopyOutputStream *local_b8;
  LogFinisher local_95 [20];
  byte local_81;
  LogMessage local_80;
  byte *local_48;
  uint local_40;
  int local_3c;
  EpsCopyOutputStream *local_38;
  byte *local_30;
  uint local_24;
  byte *local_20;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  uVar1 = (this->_shape_cached_byte_size_).super___atomic_base<int>._M_i;
  stream_local = (EpsCopyOutputStream *)target;
  if (0 < (int)uVar1) {
    this_00 = _internal_shape(this);
    local_48 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    local_3c = 1;
    local_40 = 2;
    local_81 = 0;
    local_38 = stream;
    if (stream->end_ <= local_48) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_80,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x36d);
      local_81 = 1;
      other = google::protobuf::internal::LogMessage::operator<<
                        (&local_80,"CHECK failed: ptr < end_: ");
      google::protobuf::internal::LogFinisher::operator=(local_95,other);
    }
    if ((local_81 & 1) != 0) {
      google::protobuf::internal::LogMessage::~LogMessage(&local_80);
    }
    local_24 = local_3c << 3 | local_40;
    local_30 = local_48;
    *local_48 = (byte)local_24;
    if (local_24 < 0x80) {
      local_20 = local_48 + 1;
    }
    else {
      *local_48 = *local_48 | 0x80;
      local_24 = local_24 >> 7;
      local_48[1] = (byte)local_24;
      if (local_24 < 0x80) {
        local_20 = local_48 + 2;
      }
      else {
        local_30 = local_48 + 2;
        do {
          local_30[-1] = local_30[-1] | 0x80;
          local_24 = local_24 >> 7;
          *local_30 = (byte)local_24;
          local_30 = local_30 + 1;
          local_20 = local_30;
        } while (0x7f < local_24);
      }
    }
    local_18 = (EpsCopyOutputStream *)local_20;
    for (local_c = uVar1; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_f0 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_18 = local_f0;
    plVar5 = google::protobuf::RepeatedField<long>::data(this_00);
    iVar3 = google::protobuf::RepeatedField<long>::size(this_00);
    end = plVar5;
    do {
      pbVar6 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)local_f0);
      plVar9 = end + 1;
      uVar7 = google::protobuf::io::EpsCopyOutputStream::Encode64(*end);
      *pbVar6 = (byte)uVar7;
      if (uVar7 < 0x80) {
        local_b8 = (EpsCopyOutputStream *)(pbVar6 + 1);
      }
      else {
        *pbVar6 = *pbVar6 | 0x80;
        local_c0 = uVar7 >> 7;
        pbVar6[1] = (byte)local_c0;
        if (local_c0 < 0x80) {
          local_b8 = (EpsCopyOutputStream *)(pbVar6 + 2);
        }
        else {
          local_c8 = (EpsCopyOutputStream *)(pbVar6 + 2);
          do {
            local_c8[-1].field_0x3f = local_c8[-1].field_0x3f | 0x80;
            local_c0 = local_c0 >> 7;
            *(byte *)&local_c8->end_ = (byte)local_c0;
            local_c8 = (EpsCopyOutputStream *)((long)&local_c8->end_ + 1);
            local_b8 = local_c8;
          } while (0x7f < local_c0);
        }
      }
      local_f0 = local_b8;
      end = plVar9;
    } while (plVar9 < plVar5 + iVar3);
    stream_local = local_b8;
  }
  AVar4 = _internal_datatype(this);
  if (AVar4 != ArrayFeatureType_ArrayDataType_INVALID_ARRAY_DATA_TYPE) {
    puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    AVar4 = _internal_datatype(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(2,AVar4,puVar8);
  }
  bVar2 = _internal_has_enumeratedshapes(this);
  if (bVar2) {
    puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_00 = _Internal::enumeratedshapes(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::ArrayFeatureType_EnumeratedShapes>
                             (0x15,value_00,puVar8,stream);
  }
  bVar2 = _internal_has_shaperange(this);
  if (bVar2) {
    puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_01 = _Internal::shaperange(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::
                   InternalWriteMessage<CoreML::Specification::ArrayFeatureType_ShapeRange>
                             (0x1f,value_01,puVar8,stream);
  }
  bVar2 = _internal_has_intdefaultvalue(this);
  if (bVar2) {
    puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value = _internal_intdefaultvalue(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(0x29,value,puVar8);
  }
  bVar2 = _internal_has_floatdefaultvalue(this);
  if (bVar2) {
    puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_02 = _internal_floatdefaultvalue(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteFloatToArray
                             (0x33,value_02,puVar8);
  }
  bVar2 = _internal_has_doubledefaultvalue(this);
  if (bVar2) {
    puVar8 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local);
    value_03 = _internal_doubledefaultvalue(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteDoubleToArray
                             (0x3d,value_03,puVar8);
  }
  bVar2 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar2) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    data = (void *)std::__cxx11::string::data();
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    iVar3 = std::__cxx11::string::size();
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::io::EpsCopyOutputStream::WriteRaw
                             (stream,data,iVar3,(uint8_t *)stream_local);
  }
  return (uint8_t *)stream_local;
}

Assistant:

uint8_t* ArrayFeatureType::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.ArrayFeatureType)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated int64 shape = 1;
  {
    int byte_size = _shape_cached_byte_size_.load(std::memory_order_relaxed);
    if (byte_size > 0) {
      target = stream->WriteInt64Packed(
          1, _internal_shape(), byte_size, target);
    }
  }

  // .CoreML.Specification.ArrayFeatureType.ArrayDataType dataType = 2;
  if (this->_internal_datatype() != 0) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteEnumToArray(
      2, this->_internal_datatype(), target);
  }

  // .CoreML.Specification.ArrayFeatureType.EnumeratedShapes enumeratedShapes = 21;
  if (_internal_has_enumeratedshapes()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        21, _Internal::enumeratedshapes(this), target, stream);
  }

  // .CoreML.Specification.ArrayFeatureType.ShapeRange shapeRange = 31;
  if (_internal_has_shaperange()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        31, _Internal::shaperange(this), target, stream);
  }

  // int32 intDefaultValue = 41;
  if (_internal_has_intdefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt32ToArray(41, this->_internal_intdefaultvalue(), target);
  }

  // float floatDefaultValue = 51;
  if (_internal_has_floatdefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteFloatToArray(51, this->_internal_floatdefaultvalue(), target);
  }

  // double doubleDefaultValue = 61;
  if (_internal_has_doubledefaultvalue()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(61, this->_internal_doubledefaultvalue(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.ArrayFeatureType)
  return target;
}